

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O0

void __thiscall
Js::JavascriptRegExpConstructor::JavascriptRegExpConstructor
          (JavascriptRegExpConstructor *this,DynamicType *type,ConstructorCache *cache)

{
  bool bVar1;
  ScriptContext *this_00;
  JavascriptLibrary *this_01;
  JavascriptString *ptr;
  Type *local_78;
  int local_6c;
  int i;
  JavascriptString *emptyString;
  ScriptContext *scriptContext;
  ConstructorCache *local_50;
  ConstructorCache *cache_local;
  DynamicType *type_local;
  JavascriptRegExpConstructor *this_local;
  int local_2c;
  void *local_28;
  ScriptContext *local_20;
  int local_14;
  void *local_10;
  
  local_50 = cache;
  cache_local = (ConstructorCache *)type;
  type_local = (DynamicType *)this;
  RuntimeFunction::RuntimeFunction
            (&this->super_RuntimeFunction,type,
             (FunctionInfo *)JavascriptRegExp::EntryInfo::NewInstance,cache);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01e3c170;
  scriptContext = (ScriptContext *)0x0;
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierPtr
            (&this->lastPattern,&scriptContext);
  Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierPtr(&this->lastInput);
  UnifiedRegex::GroupInfo::GroupInfo(&this->lastMatch);
  this->invalidatedLastMatch = false;
  this->reset = false;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->lastParen);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->lastIndex);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->index);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->leftContext);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->rightContext);
  local_78 = this->captures;
  do {
    Memory::WriteBarrierPtr<void>::WriteBarrierPtr(local_78);
    local_78 = local_78 + 1;
  } while ((JavascriptRegExpConstructor *)local_78 != this + 1);
  JavascriptFunction::VerifyEntryPoint((JavascriptFunction *)this);
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_01 = ScriptContext::GetLibrary(this_00);
  ptr = JavascriptLibrary::GetEmptyString(this_01);
  Memory::WriteBarrierPtr<Js::JavascriptString>::operator=(&this->lastInput,ptr);
  local_14 = -1;
  local_20 = this_00;
  bVar1 = TaggedInt::IsOverflow(-1);
  if (bVar1) {
    local_10 = JavascriptNumber::NewInlined((double)local_14,local_20);
  }
  else {
    local_10 = TaggedInt::ToVarUnchecked(local_14);
  }
  Memory::WriteBarrierPtr<void>::operator=(&this->index,local_10);
  local_2c = -1;
  this_local = (JavascriptRegExpConstructor *)this_00;
  bVar1 = TaggedInt::IsOverflow(-1);
  if (bVar1) {
    local_28 = JavascriptNumber::NewInlined((double)local_2c,(ScriptContext *)this_local);
  }
  else {
    local_28 = TaggedInt::ToVarUnchecked(local_2c);
  }
  Memory::WriteBarrierPtr<void>::operator=(&this->lastIndex,local_28);
  Memory::WriteBarrierPtr<void>::operator=(&this->lastParen,ptr);
  Memory::WriteBarrierPtr<void>::operator=(&this->leftContext,ptr);
  Memory::WriteBarrierPtr<void>::operator=(&this->rightContext,ptr);
  for (local_6c = 0; local_6c < 10; local_6c = local_6c + 1) {
    Memory::WriteBarrierPtr<void>::operator=(this->captures + local_6c,ptr);
  }
  return;
}

Assistant:

JavascriptRegExpConstructor::JavascriptRegExpConstructor(DynamicType* type, ConstructorCache* cache) :
        RuntimeFunction(type, &JavascriptRegExp::EntryInfo::NewInstance, cache),
        reset(false),
        invalidatedLastMatch(false),
        lastPattern(nullptr),
        lastMatch() // undefined
    {
        DebugOnly(VerifyEntryPoint());
        ScriptContext* scriptContext = this->GetScriptContext();
        JavascriptString* emptyString = scriptContext->GetLibrary()->GetEmptyString();
        this->lastInput = emptyString;
        this->index = JavascriptNumber::ToVar(-1, scriptContext);
        this->lastIndex = JavascriptNumber::ToVar(-1, scriptContext);
        this->lastParen = emptyString;
        this->leftContext = emptyString;
        this->rightContext = emptyString;
        for (int i = 0; i < NumCtorCaptures; i++)
        {
            this->captures[i] = emptyString;
        }
    }